

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O2

SourceBase * __thiscall
COLLADASaxFWL::SourceArrayLoader::getSourceById(SourceArrayLoader *this,String *sourceId)

{
  SourceBase *pSVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((this->mSourceArray).mCount <= uVar3) {
      return (SourceBase *)0x0;
    }
    pSVar1 = (this->mSourceArray).mData[uVar3];
    bVar2 = COLLADABU::Utils::equals(&pSVar1->mId,sourceId);
    uVar3 = uVar3 + 1;
  } while (!bVar2);
  return pSVar1;
}

Assistant:

SourceBase* SourceArrayLoader::getSourceById ( const String& sourceId ) 
    {
        for ( size_t i=0; i<mSourceArray.getCount (); ++i )
        {
            SourceBase* source = mSourceArray [ i ];
            if ( COLLADABU::Utils::equals ( source->getId (), sourceId ) )
                return source;
        }
        return 0;
    }